

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

DefinitionSymbol * __thiscall slang::ast::Symbol::getDeclaringDefinition(Symbol *this)

{
  while( true ) {
    if (this->kind == InstanceBody) {
      return (DefinitionSymbol *)this[2].name._M_str;
    }
    if (this->parentScope == (Scope *)0x0) break;
    this = this->parentScope->thisSym;
  }
  return (DefinitionSymbol *)0x0;
}

Assistant:

const DefinitionSymbol* Symbol::getDeclaringDefinition() const {
    auto curr = this;
    while (curr->kind != SymbolKind::InstanceBody) {
        auto scope = curr->getParentScope();
        if (!scope)
            return nullptr;

        curr = &scope->asSymbol();
    }

    return &curr->as<InstanceBodySymbol>().getDefinition();
}